

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::TryFastAppend
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,char *ip,size_t available,
          size_t length)

{
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  
  pcVar1 = this->op_ptr_;
  bVar2 = 0xf < (int)this->op_limit_ - (int)pcVar1;
  if (bVar2 && (0x14 < available && length < 0x11)) {
    uVar3 = *(undefined8 *)(ip + 8);
    *(undefined8 *)pcVar1 = *(undefined8 *)ip;
    *(undefined8 *)(pcVar1 + 8) = uVar3;
    this->op_ptr_ = pcVar1 + length;
  }
  return bVar2 && (0x14 < available && length < 0x11);
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t length) {
    char* op = op_ptr_;
    const int space_left = op_limit_ - op;
    if (length <= 16 && available >= 16 + kMaximumTagLength &&
        space_left >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, op);
      op_ptr_ = op + length;
      return true;
    } else {
      return false;
    }
  }